

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

QAbstractButton * __thiscall
QMessageBoxPrivate::abstractButtonForId(QMessageBoxPrivate *this,int id)

{
  QMessageBox *pQVar1;
  uint in_ESI;
  QMessageBoxPrivate *in_RDI;
  QAbstractButton *result;
  QMessageBox *q;
  qsizetype in_stack_ffffffffffffffc8;
  undefined8 local_8;
  StandardButton which;
  
  pQVar1 = q_func(in_RDI);
  which = (StandardButton)((ulong)pQVar1 >> 0x20);
  local_8 = QList<QAbstractButton_*>::value
                      ((QList<QAbstractButton_*> *)in_RDI,in_stack_ffffffffffffffc8);
  if (local_8 == (QAbstractButton *)0x0) {
    if ((in_ESI & 0x300) == 0) {
      newButton(in_ESI);
      local_8 = QMessageBox::button((QMessageBox *)in_RDI,which);
    }
    else {
      local_8 = (QAbstractButton *)0x0;
    }
  }
  return local_8;
}

Assistant:

QAbstractButton *QMessageBoxPrivate::abstractButtonForId(int id) const
{
    Q_Q(const QMessageBox);
    QAbstractButton *result = customButtonList.value(id);
    if (result)
        return result;
    if (id & QMessageBox::FlagMask)    // for compatibility with Qt 4.0/4.1 (even if it is silly)
        return nullptr;
    return q->button(newButton(id));
}